

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O0

string * __thiscall
tinyusdz::(anonymous_namespace)::DumpPrimTreeRec_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Prim *prim,uint32_t depth)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  Path *v;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *this_00;
  uint32_t n;
  uint32_t n_00;
  string local_280;
  reference local_260;
  Prim *child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *__range2;
  allocator local_231;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined4 local_1ac;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [380];
  uint local_1c;
  Prim *pPStack_18;
  uint32_t depth_local;
  Prim *prim_local;
  
  local_1c = (uint)prim;
  pPStack_18 = (Prim *)this;
  prim_local = (Prim *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  if (local_1c < 0x8000001) {
    pprint::Indent_abi_cxx11_(&local_1d0,(pprint *)(ulong)local_1c,n);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_1d0);
    poVar2 = ::std::operator<<(poVar2,"\"");
    psVar3 = Prim::element_name_abi_cxx11_(pPStack_18);
    poVar2 = ::std::operator<<(poVar2,(string *)psVar3);
    poVar2 = ::std::operator<<(poVar2,"\" ");
    v = Prim::absolute_path(pPStack_18);
    poVar2 = ::std::operator<<(poVar2,v);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::~string((string *)&local_1d0);
    pprint::Indent_abi_cxx11_(&local_1f0,(pprint *)(ulong)(local_1c + 1),n_00);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_1f0);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_230,"prim_id {}",&local_231);
    __range2 = (vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)Prim::prim_id(pPStack_18);
    fmt::format<long>(&local_210,&local_230,(long *)&__range2);
    poVar2 = ::std::operator<<(poVar2,(string *)&local_210);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::~string((string *)&local_210);
    ::std::__cxx11::string::~string((string *)&local_230);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_231);
    ::std::__cxx11::string::~string((string *)&local_1f0);
    this_00 = Prim::children(pPStack_18);
    __end2._M_current =
         (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::begin(this_00);
    child = (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::end(this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                                  *)&child);
      if (!bVar1) break;
      local_260 = __gnu_cxx::
                  __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                  ::operator*(&__end2);
      DumpPrimTreeRec_abi_cxx11_
                (&local_280,(_anonymous_namespace_ *)local_260,(Prim *)(ulong)(local_1c + 1),depth);
      ::std::operator<<(aoStack_198,(string *)&local_280);
      ::std::__cxx11::string::~string((string *)&local_280);
      __gnu_cxx::
      __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
      ::operator++(&__end2);
    }
    ::std::__cxx11::stringstream::str();
  }
  else {
    ::std::__cxx11::stringstream::str();
  }
  local_1ac = 1;
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string DumpPrimTreeRec(const Prim &prim, uint32_t depth) {
  std::stringstream ss;

  if (depth > 1024 * 1024 * 128) {
    // too deep node.
    return ss.str();
  }

  ss << pprint::Indent(depth) << "\"" << prim.element_name() << "\" "
     << prim.absolute_path() << "\n";
  ss << pprint::Indent(depth + 1) << fmt::format("prim_id {}", prim.prim_id())
     << "\n";

  for (const Prim &child : prim.children()) {
    ss << DumpPrimTreeRec(child, depth + 1);
  }

  return ss.str();
}